

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O3

bool EV_TeleportGroup(int group_tid,AActor *victim,int source_tid,int dest_tid,bool moveSource,
                     bool fog)

{
  AActor *source;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  AActor *dest;
  PClass *pPVar5;
  PClass *pPVar6;
  AActor *victim_00;
  NActorIterator iterator;
  FName local_6c;
  DAngle local_68;
  NActorIterator local_60;
  DVector3 local_48;
  undefined4 extraout_var;
  
  if (source_tid != 0) {
    for (source = AActor::TIDHash[source_tid & 0x7f]; source != (AActor *)0x0;
        source = source->inext) {
      if (source->tid == source_tid) {
        local_60.super_FActorIterator.base = (AActor *)0x0;
        local_6c.Index = 0x7c;
        local_60.super_FActorIterator.id = dest_tid;
        local_60.type = PClass::FindClass(&local_6c);
        dest = NActorIterator::Next(&local_60);
        if (dest == (AActor *)0x0) {
          return false;
        }
        iVar4 = FName::NameManager::FindName(&FName::NameData,"TeleportDest2",true);
        local_60.super_FActorIterator.base =
             (AActor *)CONCAT44(local_60.super_FActorIterator.base._4_4_,iVar4);
        pPVar5 = PClass::FindClass((FName *)&local_60);
        pPVar6 = (dest->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar4 = (**(dest->super_DThinker).super_DObject._vptr_DObject)(dest);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
          (dest->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar1 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar5 || !bVar1) goto LAB_00458ffa;
        goto LAB_00458fe2;
      }
    }
  }
  bVar1 = EV_TeleportOther(group_tid,dest_tid,fog);
  return bVar1;
  while (pPVar6 != (PClass *)0x0) {
LAB_00458fe2:
    pPVar6 = pPVar6->ParentClass;
    bVar1 = pPVar6 != (PClass *)0x0;
    if (pPVar6 == pPVar5) break;
  }
LAB_00458ffa:
  if (group_tid == 0 && victim != (AActor *)0x0) {
    bVar2 = DoGroupForOne(victim,source,dest,(bool)(bVar1 ^ 1U),fog);
  }
  else if ((group_tid == 0) ||
          (victim_00 = AActor::TIDHash[group_tid & 0x7f], victim_00 == (AActor *)0x0)) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    do {
      if (victim_00->tid == group_tid) {
        bVar3 = DoGroupForOne(victim_00,source,dest,(bool)(bVar1 ^ 1U),fog);
        bVar2 = (bool)(bVar2 | bVar3);
      }
      victim_00 = victim_00->inext;
    } while (victim_00 != (AActor *)0x0);
  }
  if ((moveSource) && (bVar2 != false)) {
    if (bVar1 == false) {
      local_48.Z = -2147483648.0;
    }
    else {
      local_48.Z = (dest->__Pos).Z;
    }
    local_48.X = (dest->__Pos).X;
    local_48.Y = (dest->__Pos).Y;
    local_68.Degrees = 0.0;
    P_Teleport(source,&local_48,&local_68,4);
    (source->Angles).Yaw.Degrees = (dest->Angles).Yaw.Degrees;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool EV_TeleportGroup (int group_tid, AActor *victim, int source_tid, int dest_tid, bool moveSource, bool fog)
{
	AActor *sourceOrigin, *destOrigin;
	{
		FActorIterator iterator (source_tid);
		sourceOrigin = iterator.Next ();
	}
	if (sourceOrigin == NULL)
	{ // If there is no source origin, behave like TeleportOther
		return EV_TeleportOther (group_tid, dest_tid, fog);
	}

	{
		NActorIterator iterator (NAME_TeleportDest, dest_tid);
		destOrigin = iterator.Next ();
	}
	if (destOrigin == NULL)
	{
		return false;
	}

	bool didSomething = false;
	bool floorz = !destOrigin->IsKindOf (PClass::FindClass("TeleportDest2"));

	// Use the passed victim if group_tid is 0
	if (group_tid == 0 && victim != NULL)
	{
		didSomething = DoGroupForOne (victim, sourceOrigin, destOrigin, floorz, fog);
	}
	else
	{
		FActorIterator iterator (group_tid);

		// For each actor with tid matching arg0, move it to the same
		// position relative to destOrigin as it is relative to sourceOrigin
		// before the teleport.
		while ( (victim = iterator.Next ()) )
		{
			didSomething |= DoGroupForOne (victim, sourceOrigin, destOrigin, floorz, fog);
		}
	}

	if (moveSource && didSomething)
	{
		didSomething |=
			P_Teleport (sourceOrigin, destOrigin->PosAtZ(floorz ? ONFLOORZ : destOrigin->Z()), 0., TELF_KEEPORIENTATION);
		sourceOrigin->Angles.Yaw = destOrigin->Angles.Yaw;
	}

	return didSomething;
}